

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O0

int __thiscall QWizardPage::qt_metacall(QWizardPage *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  Call in_stack_fffffffffffffff4;
  QObject *_o;
  
  _o = *(QObject **)(in_FS_OFFSET + 0x28);
  iVar1 = QWidget::qt_metacall
                    ((QWidget *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 3) {
        qt_static_metacall(_o,in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
                           (void **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      }
      iVar1 = iVar1 + -3;
    }
    if (in_ESI == 7) {
      if (iVar1 < 3) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(ulong *)*in_RCX = CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
      }
      iVar1 = iVar1 + -3;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(_o,in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
                         (void **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      iVar1 = iVar1 + -2;
    }
  }
  if (*(QObject **)(in_FS_OFFSET + 0x28) != _o) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QWizardPage::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 3;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}